

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NFiles.cpp
# Opt level: O1

void __thiscall amrex::NFilesIter::CleanUpMessages(NFilesIter *this)

{
  return;
}

Assistant:

void NFilesIter::CleanUpMessages() {
#ifdef BL_USE_MPI
  BL_PROFILE("NFI::CleanUpMessages");
  for(int i(0); i < unreadMessages.size(); ++i) {
    std::pair<int, int> & pii = unreadMessages[i];
    int fromProc, tag(pii.first), nMessages(pii.second);
#if 0
    amrex::AllPrint() << ParallelDescriptor::MyProc() << ":: cleaning up " << nMessages
              << " messages for tag " << tag << std::endl;
#endif
    for(int n(0); n < nMessages; ++n) {
      ParallelDescriptor::Recv(&fromProc, 1, MPI_ANY_SOURCE, tag);
    }
  }
  unreadMessages.clear();
#endif
}